

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

cmd_ln_t * cmd_ln_parse_r(ps_config_t *inout_cmdln,ps_arg_t *defn,int32 argc,char **argv,int strict)

{
  int32 iVar1;
  void *local_88;
  void *v_2;
  void *v_1;
  char *name;
  cmd_ln_val_t *val;
  ps_arg_t *argdef;
  void *v;
  ps_config_t *cmdln;
  hash_table_t *defidx;
  int local_40;
  int32 argstart;
  int32 n;
  int32 j;
  int32 i;
  int strict_local;
  char **argv_local;
  ps_arg_t *ppStack_20;
  int32 argc_local;
  ps_arg_t *defn_local;
  ps_config_t *inout_cmdln_local;
  
  cmdln = (ps_config_t *)0x0;
  v = inout_cmdln;
  j = strict;
  _i = argv;
  argv_local._4_4_ = argc;
  ppStack_20 = defn;
  defn_local = (ps_arg_t *)inout_cmdln;
  if (inout_cmdln == (ps_config_t *)0x0) {
    v = ps_config_init(defn);
    ((ps_config_t *)v)->defn = ppStack_20;
  }
  cmdln = (ps_config_t *)hash_table_new(0x32,0);
  if (ppStack_20 == (ps_arg_t *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = 0;
    while (ppStack_20[local_40].name != (char *)0x0) {
      argdef = (ps_arg_t *)
               hash_table_enter((hash_table_t *)cmdln,ppStack_20[local_40].name,
                                ppStack_20 + local_40);
      if ((j != 0) && (argdef != ppStack_20 + local_40)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x140,"Duplicate argument name in definition: %s\n",ppStack_20[local_40].name);
        goto LAB_00114d66;
      }
      local_40 = local_40 + 1;
    }
  }
  defidx._4_4_ = 0;
  if ((0 < argv_local._4_4_) && (**_i != '-')) {
    defidx._4_4_ = 1;
  }
  argstart = defidx._4_4_;
  do {
    if (argv_local._4_4_ <= argstart) {
      argstart = 0;
      for (n = 0; n < local_40; n = n + 1) {
        if (((ppStack_20[n].type & 1U) != 0) &&
           (iVar1 = hash_table_lookup(*(hash_table_t **)((long)v + 8),ppStack_20[n].name,&local_88),
           iVar1 != 0)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x186,"Missing required argument %s\n",ppStack_20[n].name);
        }
      }
      if (argstart < 1) {
        if ((j == 0) || (argv_local._4_4_ != 1)) {
          hash_table_free((hash_table_t *)cmdln);
          inout_cmdln_local = (ps_config_t *)v;
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x18e,"No arguments given\n");
          if (cmdln != (ps_config_t *)0x0) {
            hash_table_free((hash_table_t *)cmdln);
          }
          if (defn_local == (ps_arg_t *)0x0) {
            ps_config_free((ps_config_t *)v);
          }
          inout_cmdln_local = (ps_config_t *)0x0;
        }
      }
      else {
LAB_00114d66:
        if (cmdln != (ps_config_t *)0x0) {
          hash_table_free((hash_table_t *)cmdln);
        }
        if (defn_local == (ps_arg_t *)0x0) {
          ps_config_free((ps_config_t *)v);
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x19e,"Failed to parse arguments list\n");
        inout_cmdln_local = (ps_config_t *)0x0;
      }
      return inout_cmdln_local;
    }
    v_1 = _i[argstart];
    if ((*v_1 != '\0') && (*v_1 == '-')) {
      v_1 = (void *)((long)v_1 + 1);
    }
    if ((*v_1 != '\0') && (*v_1 == '-')) {
      v_1 = (void *)((long)v_1 + 1);
    }
    iVar1 = hash_table_lookup((hash_table_t *)cmdln,(char *)v_1,&v_2);
    if (iVar1 < 0) {
      if (j != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x15f,"Unknown argument name \'%s\'\n",v_1);
        goto LAB_00114d66;
      }
      if (ppStack_20 == (ps_arg_t *)0x0) {
        v_2 = (void *)0x0;
        goto LAB_00114b31;
      }
    }
    else {
LAB_00114b31:
      val = (cmd_ln_val_t *)v_2;
      if (argv_local._4_4_ <= argstart + 1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0x16b,"Argument value for \'%s\' missing\n",v_1);
        goto LAB_00114d66;
      }
      if (v_2 == (void *)0x0) {
        name = (char *)cmd_ln_val_init(8,(char *)v_1,_i[argstart + 1]);
      }
      else {
        name = (char *)cmd_ln_val_init(*(int *)((long)v_2 + 8),(char *)v_1,_i[argstart + 1]);
        if ((cmd_ln_val_t *)name == (cmd_ln_val_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x173,"Bad argument value for %s: %s\n",v_1,_i[argstart + 1]);
          goto LAB_00114d66;
        }
      }
      v_2 = hash_table_enter(*(hash_table_t **)((long)v + 8),*(char **)(name + 0x10),name);
      if ((char *)v_2 != name) {
        v_2 = hash_table_replace(*(hash_table_t **)((long)v + 8),*(char **)(name + 0x10),name);
        cmd_ln_val_free((cmd_ln_val_t *)v_2);
      }
    }
    argstart = argstart + 2;
  } while( true );
}

Assistant:

ps_config_t *
cmd_ln_parse_r(ps_config_t *inout_cmdln, const ps_arg_t * defn,
               int32 argc, char *argv[], int strict)
{
    int32 i, j, n, argstart;
    hash_table_t *defidx = NULL;
    ps_config_t *cmdln;

    /* Construct command-line object */
    if (inout_cmdln == NULL) {
        cmdln = ps_config_init(defn);
        cmdln->defn = defn;
    }
    else /* FIXME: definitions should just be in the ps_config_t */
        cmdln = inout_cmdln;

    /* Build a hash table for argument definitions */
    defidx = hash_table_new(50, 0);
    if (defn) {
        for (n = 0; defn[n].name; n++) {
            void *v;

            v = hash_table_enter(defidx, defn[n].name, (void *)&defn[n]);
            if (strict && (v != &defn[n])) {
                E_ERROR("Duplicate argument name in definition: %s\n", defn[n].name);
                goto error;
            }
        }
    }
    else {
        /* No definitions. */
        n = 0;
    }

    /* skip argv[0] if it doesn't start with dash (starting with a
     * dash would only happen if called from parse_options()) */
    argstart = 0;
    if (argc > 0 && argv[0][0] != '-') {
        argstart = 1;
    }

    /* Parse command line arguments (name-value pairs) */
    for (j = argstart; j < argc; j += 2) {
        ps_arg_t *argdef;
        cmd_ln_val_t *val;
        char *name;
        void *v;

        name = argv[j];
        if (*name && *name == '-')
            ++name;
        if (*name && *name == '-')
            ++name;
        if (hash_table_lookup(defidx, name, &v) < 0) {
            if (strict) {
                E_ERROR("Unknown argument name '%s'\n", name);
                goto error;
            }
            else if (defn == NULL)
                v = NULL;
            else
                continue;
        }
        argdef = (ps_arg_t *)v;

        /* Enter argument value */
        if (j + 1 >= argc) {
            E_ERROR("Argument value for '%s' missing\n", name);
            goto error;
        }

        if (argdef == NULL)
            val = cmd_ln_val_init(ARG_STRING, name, argv[j + 1]);
        else {
            if ((val = cmd_ln_val_init(argdef->type, name, argv[j + 1])) == NULL) {
                E_ERROR("Bad argument value for %s: %s\n", name, argv[j + 1]);
                goto error;
            }
        }

        if ((v = hash_table_enter(cmdln->ht, val->name, (void *)val)) !=
            (void *)val)
        {
            v = hash_table_replace(cmdln->ht, val->name, (void *)val);
            cmd_ln_val_free((cmd_ln_val_t *)v);
        }
    }

    /* Check for required arguments; exit if any missing */
    j = 0;
    for (i = 0; i < n; i++) {
        if (defn[i].type & ARG_REQUIRED) {
            void *v;
            if (hash_table_lookup(cmdln->ht, defn[i].name, &v) != 0)
                E_ERROR("Missing required argument %s\n", defn[i].name);
        }
    }
    if (j > 0) {
        goto error;
    }

    if (strict && argc == 1) {
        E_ERROR("No arguments given\n");
        if (defidx)
            hash_table_free(defidx);
        if (inout_cmdln == NULL)
            ps_config_free(cmdln);
        return NULL;
    }

    hash_table_free(defidx);
    return cmdln;

  error:
    if (defidx)
        hash_table_free(defidx);
    if (inout_cmdln == NULL)
        ps_config_free(cmdln);
    E_ERROR("Failed to parse arguments list\n");
    return NULL;
}